

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLAttribute * __thiscall tinyxml2::XMLElement::FindOrCreateAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  char *p;
  XMLAttribute *pXVar2;
  XMLAttribute **ppXVar3;
  XMLAttribute *pXVar4;
  
  ppXVar3 = &this->_rootAttribute;
  pXVar4 = (XMLAttribute *)0x0;
  while( true ) {
    pXVar2 = *ppXVar3;
    if (pXVar2 == (XMLAttribute *)0x0) {
      pXVar2 = (XMLAttribute *)
               MemPoolT<72>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
      pXVar2->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00275b00;
      (pXVar2->_name)._flags = 0;
      (pXVar2->_value)._flags = 0;
      (pXVar2->_name)._start = (char *)0x0;
      (pXVar2->_name)._end = (char *)0x0;
      (pXVar2->_value)._start = (char *)0x0;
      (pXVar2->_value)._end = (char *)0x0;
      pXVar2->_next = (XMLAttribute *)0x0;
      pXVar2->_memPool = (MemPool *)0x0;
      pXVar2->_memPool = &(((this->super_XMLNode)._document)->_attributePool).super_MemPool;
      ppXVar3 = &pXVar4->_next;
      if (pXVar4 == (XMLAttribute *)0x0) {
        ppXVar3 = &this->_rootAttribute;
      }
      *ppXVar3 = pXVar2;
      XMLAttribute::SetName(pXVar2,name);
      (*pXVar2->_memPool->_vptr_MemPool[5])();
      return pXVar2;
    }
    p = StrPair::GetStr(&pXVar2->_name);
    bVar1 = XMLUtil::StringEqual(p,name,0x7fffffff);
    if (bVar1) break;
    ppXVar3 = &pXVar2->_next;
    pXVar4 = pXVar2;
  }
  return pXVar2;
}

Assistant:

XMLAttribute* XMLElement::FindOrCreateAttribute( const char* name )
{
    XMLAttribute* last = 0;
    XMLAttribute* attrib = 0;
    for( attrib = _rootAttribute;
            attrib;
            last = attrib, attrib = attrib->_next ) {
        if ( XMLUtil::StringEqual( attrib->Name(), name ) ) {
            break;
        }
    }
    if ( !attrib ) {
        TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
        attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
        attrib->_memPool = &_document->_attributePool;
        if ( last ) {
            last->_next = attrib;
        }
        else {
            _rootAttribute = attrib;
        }
        attrib->SetName( name );
        attrib->_memPool->SetTracked(); // always created and linked.
    }
    return attrib;
}